

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O3

bool __thiscall
OSSLEDDSA::reconstructPrivateKey
          (OSSLEDDSA *this,PrivateKey **ppPrivateKey,ByteString *serialisedData)

{
  char cVar1;
  size_t sVar2;
  OSSLEDPrivateKey *this_00;
  
  if ((ppPrivateKey != (PrivateKey **)0x0) && (sVar2 = ByteString::size(serialisedData), sVar2 != 0)
     ) {
    this_00 = (OSSLEDPrivateKey *)operator_new(0x68);
    OSSLEDPrivateKey::OSSLEDPrivateKey(this_00);
    cVar1 = (**(code **)(*(long *)&this_00->super_EDPrivateKey + 0x68))(this_00,serialisedData);
    if (cVar1 != '\0') {
      *ppPrivateKey = (PrivateKey *)this_00;
      return true;
    }
    (**(code **)(*(long *)&this_00->super_EDPrivateKey + 0x10))(this_00);
  }
  return false;
}

Assistant:

bool OSSLEDDSA::reconstructPrivateKey(PrivateKey** ppPrivateKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPrivateKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLEDPrivateKey* priv = new OSSLEDPrivateKey();

	if (!priv->deserialise(serialisedData))
	{
		delete priv;

		return false;
	}

	*ppPrivateKey = priv;

	return true;
}